

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tld-tree.c
# Opt level: O0

void faup_tld_tree_add_tld(char *tld,void *user_data)

{
  size_t sVar1;
  TLDNode *local_28;
  TLDNode *Tree;
  void *pvStack_18;
  int retval;
  void *user_data_local;
  char *tld_local;
  
  local_28 = (TLDNode *)user_data;
  pvStack_18 = user_data;
  user_data_local = tld;
  sVar1 = strlen(tld);
  Tree._4_4_ = faup_tld_tree_add_node(&local_28,tld,(int)sVar1);
  if (Tree._4_4_ != 0) {
    fprintf(_stderr,"Error adding the tld \'%s\' to the tree\n",user_data_local);
  }
  return;
}

Assistant:

static void faup_tld_tree_add_tld(char *tld, void *user_data)
{
	int retval;

	TLDNode *Tree = (TLDNode *)user_data;

	retval = faup_tld_tree_add_node(&Tree, tld, strlen(tld));
	if (retval) {
		fprintf(stderr, "Error adding the tld '%s' to the tree\n", tld);
	}

}